

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::AnonymousProgramSyntax::setChild
          (AnonymousProgramSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0041aa94 + *(int *)(&DAT_0041aa94 + index * 4)))
            (&child,index,in_RDX,&DAT_0041aa94 + *(int *)(&DAT_0041aa94 + index * 4));
  return;
}

Assistant:

void AnonymousProgramSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: semi = child.token(); return;
        case 3: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 4: endkeyword = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}